

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O0

time_t time1(tm *tmp,_func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp,state *sp,
            int_fast32_t offset)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  time_t tVar4;
  _Bool local_259;
  byte abStack_258 [7];
  _Bool okay;
  uchar types [256];
  char seen [256];
  int local_50;
  int local_4c;
  int nseen;
  int i;
  int otherind;
  int sameind;
  int otheri;
  int samei;
  time_t t;
  int_fast32_t offset_local;
  state *sp_local;
  _func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp_local;
  tm *tmp_local;
  
  if (tmp == (tm *)0x0) {
    piVar3 = _PDCLIB_errno_func();
    *piVar3 = 0x16;
    tmp_local = (tm *)0xffffffffffffffff;
  }
  else {
    if (1 < tmp->tm_isdst) {
      tmp->tm_isdst = 1;
    }
    tmp_local = (tm *)time2(tmp,funcp,sp,offset,&local_259);
    if (((local_259 & 1U) == 0) && (-1 < tmp->tm_isdst)) {
      if (sp == (state *)0x0) {
        tmp_local = (tm *)0xffffffffffffffff;
      }
      else {
        for (local_4c = 0; local_4c < sp->typecnt; local_4c = local_4c + 1) {
          types[(long)local_4c + 0xf8] = '\0';
        }
        local_50 = 0;
        local_4c = sp->timecnt;
        while (local_4c = local_4c + -1, -1 < local_4c) {
          if (types[(ulong)sp->types[local_4c] + 0xf8] == '\0') {
            types[(ulong)sp->types[local_4c] + 0xf8] = '\x01';
            abStack_258[local_50] = sp->types[local_4c];
            local_50 = local_50 + 1;
          }
        }
        for (i = 0; i < local_50; i = i + 1) {
          uVar1 = (uint)abStack_258[i];
          if ((uint)(sp->ttis[(int)uVar1].isdst & 1) == tmp->tm_isdst) {
            for (nseen = 0; nseen < local_50; nseen = nseen + 1) {
              uVar2 = (uint)abStack_258[nseen];
              if ((uint)(sp->ttis[(int)uVar2].isdst & 1) != tmp->tm_isdst) {
                tmp->tm_sec = (sp->ttis[(int)uVar2].utoff - sp->ttis[(int)uVar1].utoff) +
                              tmp->tm_sec;
                tmp->tm_isdst = (uint)((tmp->tm_isdst != 0 ^ 0xffU) & 1);
                tVar4 = time2(tmp,funcp,sp,offset,&local_259);
                if ((local_259 & 1U) != 0) {
                  return tVar4;
                }
                tmp->tm_sec = tmp->tm_sec -
                              (sp->ttis[(int)uVar2].utoff - sp->ttis[(int)uVar1].utoff);
                tmp->tm_isdst = (uint)((tmp->tm_isdst != 0 ^ 0xffU) & 1);
              }
            }
          }
        }
        tmp_local = (tm *)0xffffffffffffffff;
      }
    }
  }
  return (time_t)tmp_local;
}

Assistant:

static time_t time1( struct tm * tmp, struct tm *(*funcp)( struct state const *, time_t const *, int_fast32_t, struct tm * ), struct state const * sp, const int_fast32_t offset )
{
    time_t        t;
    int           samei, otheri;
    int           sameind, otherind;
    int           i;
    int           nseen;
    char          seen[TZ_MAX_TYPES];
    unsigned char types[TZ_MAX_TYPES];
    bool          okay;

    if ( tmp == NULL )
    {
        *_PDCLIB_errno_func() = _PDCLIB_EINVAL;
        return WRONG;
    }

    if ( tmp->tm_isdst > 1 )
    {
        tmp->tm_isdst = 1;
    }

    t = time2( tmp, funcp, sp, offset, &okay );

    if ( okay )
    {
        return t;
    }

    if ( tmp->tm_isdst < 0 )
    {
#ifdef PCTS
        /* POSIX Conformance Test Suite code courtesy Grant Sullivan. */
        tmp->tm_isdst = 0;  /* reset to std and try again */
#else
        return t;
#endif
    }

    /* We're supposed to assume that somebody took a time of one type
       and did some math on it that yielded a "struct tm" that's bad.
       We try to divine the type they started from and adjust to the
       type they need.
    */
    if ( sp == NULL )
    {
        return WRONG;
    }

    for ( i = 0; i < sp->typecnt; ++i )
    {
        seen[ i ] = false;
    }

    nseen = 0;

    for ( i = sp->timecnt - 1; i >= 0; --i )
    {
        if ( ! seen[ sp->types[ i ] ] )
        {
            seen[ sp->types[ i ] ] = true;
            types[ nseen++ ] = sp->types[ i ];
        }
    }

    for ( sameind = 0; sameind < nseen; ++sameind )
    {
        samei = types[ sameind ];

        if ( sp->ttis[ samei ].isdst != tmp->tm_isdst )
        {
            continue;
        }

        for ( otherind = 0; otherind < nseen; ++otherind )
        {
            otheri = types[ otherind ];

            if ( sp->ttis[ otheri ].isdst == tmp->tm_isdst )
            {
                continue;
            }

            tmp->tm_sec += ( sp->ttis[ otheri ].utoff - sp->ttis[ samei ].utoff );
            tmp->tm_isdst = ! tmp->tm_isdst;
            t = time2( tmp, funcp, sp, offset, &okay );

            if ( okay )
            {
                return t;
            }

            tmp->tm_sec -= ( sp->ttis[ otheri ].utoff - sp->ttis[ samei ].utoff );
            tmp->tm_isdst = ! tmp->tm_isdst;
        }
    }

    return WRONG;
}